

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu540c.c
# Opt level: O0

MPP_RET hal_h264e_vepu540c_get_task(void *hal,HalEncTask *task)

{
  long lVar1;
  EncRcTask *pEVar2;
  RK_U32 RVar3;
  RK_S32 RVar4;
  MppMeta meta_00;
  MppMeta meta;
  EncFrmStatus *frm_status;
  RK_U32 updated;
  MppEncH264HwCfg *hw_cfg;
  HalH264eVepu540cCtx *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  lVar1 = *hal;
  RVar3 = update_vepu540c_syntax((HalH264eVepu540cCtx *)hal,&task->syntax);
  pEVar2 = task->rc_task;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","enter %p\n","hal_h264e_vepu540c_get_task",hal);
  }
  if ((RVar3 & 1) != 0) {
    setup_hal_bufs((HalH264eVepu540cCtx *)hal);
  }
  if (((pEVar2->frm).val >> 0x22 & 1) == 0) {
    RVar4 = mpp_frame_has_meta(task->frame);
    if (RVar4 != 0) {
      meta_00 = mpp_frame_get_meta(task->frame);
      mpp_meta_get_ptr(meta_00,KEY_ROI_DATA,(void **)((long)hal + 0x158));
    }
  }
  *(undefined4 *)(lVar1 + 0x364) = *(undefined4 *)(*(long *)((long)hal + 0x38) + 0x28);
  h264e_vepu_stream_amend_config
            ((HalH264eVepuStreamAmend *)((long)hal + 0x70),task->packet,*hal,
             *(H264eSlice **)((long)hal + 0x48),*(H264ePrefixNal **)((long)hal + 0x68));
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","leave %p\n","hal_h264e_vepu540c_get_task",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu540c_get_task(void *hal, HalEncTask *task)
{
    HalH264eVepu540cCtx *ctx = (HalH264eVepu540cCtx *)hal;
    MppEncH264HwCfg *hw_cfg = &ctx->cfg->codec.h264.hw_cfg;
    RK_U32 updated = update_vepu540c_syntax(ctx, &task->syntax);
    EncFrmStatus *frm_status = &task->rc_task->frm;
    hal_h264e_dbg_func("enter %p\n", hal);

    if (updated & SYN_TYPE_FLAG(H264E_SYN_CFG))
        setup_hal_bufs(ctx);


    if (!frm_status->reencode && mpp_frame_has_meta(task->frame)) {
        MppMeta meta = mpp_frame_get_meta(task->frame);

        mpp_meta_get_ptr(meta, KEY_ROI_DATA, (void **)&ctx->roi_data);
    }

    /* if not VEPU1/2, update log2_max_frame_num_minus4 in hw_cfg */
    hw_cfg->hw_log2_max_frame_num_minus4 = ctx->sps->log2_max_frame_num_minus4;

    h264e_vepu_stream_amend_config(&ctx->amend, task->packet, ctx->cfg,
                                   ctx->slice, ctx->prefix);

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}